

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::captureCurrentSubroutineSet
          (FunctionalTest20_21 *this,subroutineUniformSet *set)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  subroutineUniformSet *set_local;
  FunctionalTest20_21 *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0xb50))
            (0x8b30,(this->m_subroutine_uniform_locations).m_fragment_shader_stage,
             &set->m_fragment_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformSubroutineuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x273a);
  (**(code **)(lVar4 + 0xb50))
            (0x8dd9,(this->m_subroutine_uniform_locations).m_geometry_shader_stage,
             &set->m_geometry_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformSubroutineuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x273f);
  (**(code **)(lVar4 + 0xb50))
            (0x8e88,(this->m_subroutine_uniform_locations).m_tesselation_control_shader_stage,
             &set->m_tesselation_control_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformSubroutineuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2745);
  (**(code **)(lVar4 + 0xb50))
            (0x8e87,(this->m_subroutine_uniform_locations).m_tesselation_evaluation_shader_stage,
             &set->m_tesselation_evaluation_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformSubroutineuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x274b);
  (**(code **)(lVar4 + 0xb50))
            (0x8b31,(this->m_subroutine_uniform_locations).m_vertex_shader_stage,set);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GetUniformSubroutineuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2750);
  return;
}

Assistant:

void FunctionalTest20_21::captureCurrentSubroutineSet(subroutineUniformSet& set)
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fragment */
	gl.getUniformSubroutineuiv(GL_FRAGMENT_SHADER, m_subroutine_uniform_locations.m_fragment_shader_stage,
							   &set.m_fragment_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

	/* Geometry */
	gl.getUniformSubroutineuiv(GL_GEOMETRY_SHADER, m_subroutine_uniform_locations.m_geometry_shader_stage,
							   &set.m_geometry_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

	/* Tess ctrl */
	gl.getUniformSubroutineuiv(GL_TESS_CONTROL_SHADER,
							   m_subroutine_uniform_locations.m_tesselation_control_shader_stage,
							   &set.m_tesselation_control_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

	/* Tess eval */
	gl.getUniformSubroutineuiv(GL_TESS_EVALUATION_SHADER,
							   m_subroutine_uniform_locations.m_tesselation_evaluation_shader_stage,
							   &set.m_tesselation_evaluation_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");

	/* Vertex */
	gl.getUniformSubroutineuiv(GL_VERTEX_SHADER, m_subroutine_uniform_locations.m_vertex_shader_stage,
							   &set.m_vertex_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformSubroutineuiv");
}